

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Log::backward_impl
          (Log *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_ffffffffffffff48;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff50;
  Tensor *in_stack_ffffffffffffff58;
  
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
  Tensor::operator*(in_stack_ffffffffffffff58);
  Tensor::operator*(in_stack_ffffffffffffff58);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
  cwiseQuotient<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
            ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  Tensor::operator*(in_stack_ffffffffffffff58);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::operator+=
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  return;
}

Assistant:

void Log::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
#if HAVE_CUDA
  gpu::vlog_backward(fx.d.size(), xs[0]->v, dEdf.v, dEdxi.v);
#else
  auto x = **xs[0];
  *dEdxi += (*dEdf).cwiseQuotient(x);
#endif
}